

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPolyhedralContactClipping.cpp
# Opt level: O2

void btPolyhedralContactClipping::clipHullAgainstHull
               (btVector3 *separatingNormal1,btConvexPolyhedron *hullA,btConvexPolyhedron *hullB,
               btTransform *transA,btTransform *transB,btScalar minDist,btScalar maxDist,
               Result *resultOut)

{
  uint uVar1;
  btFace *pbVar2;
  long lVar3;
  int iVar4;
  ulong uVar5;
  int face;
  ulong uVar6;
  float fVar7;
  float fVar8;
  btVector3 bVar9;
  btVector3 bVar10;
  btVertexArray worldVertsB1;
  float local_78;
  float local_68;
  float fStack_64;
  btVector3 local_50;
  btVector3 separatingNormal;
  
  bVar9 = btVector3::normalized(separatingNormal1);
  uVar5 = 0xffffffffffffffff;
  lVar3 = 0x28;
  fVar7 = -3.4028235e+38;
  separatingNormal = bVar9;
  for (uVar6 = 0; (long)uVar6 < (long)(hullB->m_faces).m_size; uVar6 = uVar6 + 1) {
    pbVar2 = (hullB->m_faces).m_data;
    worldVertsB1._0_4_ = *(undefined4 *)((long)pbVar2->m_plane + lVar3 + -0x28);
    worldVertsB1.m_capacity = *(int *)((long)pbVar2->m_plane + lVar3 + -0x20);
    worldVertsB1.m_size = *(int *)((long)pbVar2->m_plane + lVar3 + -0x24);
    worldVertsB1._12_4_ = 0;
    bVar10 = operator*(&transB->m_basis,(btVector3 *)&worldVertsB1);
    local_68 = bVar9.m_floats[0];
    fStack_64 = bVar9.m_floats[1];
    local_78 = bVar9.m_floats[2];
    fVar8 = bVar10.m_floats[2] * local_78 +
            bVar10.m_floats[0] * local_68 + bVar10.m_floats[1] * fStack_64;
    if (fVar7 < fVar8) {
      uVar5 = uVar6;
    }
    uVar5 = uVar5 & 0xffffffff;
    if (fVar8 <= fVar7) {
      fVar8 = fVar7;
    }
    lVar3 = lVar3 + 0x30;
    fVar7 = fVar8;
  }
  worldVertsB1.m_ownsMemory = true;
  worldVertsB1.m_data = (btVector3 *)0x0;
  worldVertsB1.m_size = 0;
  worldVertsB1.m_capacity = 0;
  pbVar2 = (hullB->m_faces).m_data;
  iVar4 = (int)uVar5;
  uVar1 = pbVar2[iVar4].m_indices.m_size;
  uVar6 = 0;
  uVar5 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar5 = uVar6;
  }
  for (; uVar5 != uVar6; uVar6 = uVar6 + 1) {
    local_50 = btTransform::operator()
                         (transB,(hullB->m_vertices).m_data + pbVar2[iVar4].m_indices.m_data[uVar6])
    ;
    btAlignedObjectArray<btVector3>::push_back(&worldVertsB1,&local_50);
  }
  if (-1 < iVar4) {
    clipFaceAgainstHull(&separatingNormal,hullA,transA,&worldVertsB1,minDist,maxDist,resultOut);
  }
  btAlignedObjectArray<btVector3>::~btAlignedObjectArray(&worldVertsB1);
  return;
}

Assistant:

void	btPolyhedralContactClipping::clipHullAgainstHull(const btVector3& separatingNormal1, const btConvexPolyhedron& hullA, const btConvexPolyhedron& hullB, const btTransform& transA,const btTransform& transB, const btScalar minDist, btScalar maxDist,btDiscreteCollisionDetectorInterface::Result& resultOut)
{

	btVector3 separatingNormal = separatingNormal1.normalized();
//	const btVector3 c0 = transA * hullA.m_localCenter;
//	const btVector3 c1 = transB * hullB.m_localCenter;
	//const btVector3 DeltaC2 = c0 - c1;



	int closestFaceB=-1;
	btScalar dmax = -FLT_MAX;
	{
		for(int face=0;face<hullB.m_faces.size();face++)
		{
			const btVector3 Normal(hullB.m_faces[face].m_plane[0], hullB.m_faces[face].m_plane[1], hullB.m_faces[face].m_plane[2]);
			const btVector3 WorldNormal = transB.getBasis() * Normal;
			btScalar d = WorldNormal.dot(separatingNormal);
			if (d > dmax)
			{
				dmax = d;
				closestFaceB = face;
			}
		}
	}
				btVertexArray worldVertsB1;
				{
					const btFace& polyB = hullB.m_faces[closestFaceB];
					const int numVertices = polyB.m_indices.size();
					for(int e0=0;e0<numVertices;e0++)
					{
						const btVector3& b = hullB.m_vertices[polyB.m_indices[e0]];
						worldVertsB1.push_back(transB*b);
					}
				}

	
	if (closestFaceB>=0)
		clipFaceAgainstHull(separatingNormal, hullA, transA,worldVertsB1, minDist, maxDist,resultOut);

}